

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

wchar_t mass_roll(wchar_t times,wchar_t max)

{
  uint32_t uVar1;
  wchar_t local_18;
  wchar_t local_14;
  wchar_t t;
  wchar_t i;
  wchar_t max_local;
  wchar_t times_local;
  
  local_18 = L'\0';
  if (L'\x01' < max) {
    for (local_14 = L'\0'; local_14 < times; local_14 = local_14 + L'\x01') {
      uVar1 = Rand_div(max);
      local_18 = uVar1 + local_18;
    }
    return local_18;
  }
  __assert_fail("max > 1",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                ,0x37d,"int mass_roll(int, int)");
}

Assistant:

static int mass_roll(int times, int max)
{
	int i, t = 0;

	assert(max > 1);

	for (i = 0; i < times; i++)
		t += randint0(max);

	return (t);
}